

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

e_uint32 OPLL_setMask(OPLL *opll,e_uint32 mask)

{
  e_uint32 eVar1;
  
  if (opll != (OPLL *)0x0) {
    eVar1 = opll->mask;
    opll->mask = mask;
    return eVar1;
  }
  return 0;
}

Assistant:

e_uint32
OPLL_setMask (OPLL * opll, e_uint32 mask)
{
  e_uint32 ret;

  if (opll)
  {
    ret = opll->mask;
    opll->mask = mask;
    return ret;
  }
  else
    return 0;
}